

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

void __thiscall
xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
          (CMStateSetEnumerator *this,CMStateSet *toEnum,XMLSize_t start)

{
  XMLSize_t XVar1;
  uint uVar2;
  XMLSize_t i;
  long lVar3;
  uint uVar4;
  
  this->fToEnum = toEnum;
  this->fIndexCount = 0xffffffffffffffff;
  this->fLastValue = 0;
  if (0x20 < start) {
    this->fIndexCount = (start & 0xffffffffffffffe0) - 0x20;
  }
  findNext(this);
  uVar2 = this->fLastValue;
  XVar1 = this->fIndexCount;
  if ((this->fIndexCount <= start && start != XVar1) && uVar2 != 0) {
    lVar3 = 0;
    do {
      uVar4 = (uint)(1L << ((byte)lVar3 & 0x3f));
      if ((uVar2 & uVar4) != 0) {
        uVar2 = uVar2 & ~uVar4;
        this->fLastValue = uVar2;
      }
      lVar3 = lVar3 + 1;
    } while (start - XVar1 != lVar3);
    if (uVar2 == 0) {
      findNext(this);
      return;
    }
  }
  return;
}

Assistant:

CMStateSetEnumerator(const CMStateSet* toEnum, XMLSize_t start = 0) :
      fToEnum(toEnum),
      fIndexCount((XMLSize_t)-1),
      fLastValue(0)
    {
        // if a starting bit is specified, place fIndexCount at the beginning of the previous 32 bit area
        // so the findNext moves to the one where 'start' is located
        if(start > 32)
            fIndexCount = (start/32 - 1) * 32;
        findNext();
        // if we found data, and fIndexCount is still pointing to the area where 'start' is located, erase the bits before 'start'
        if(hasMoreElements() && fIndexCount < start)
        {
            for(XMLSize_t i=0;i< (start - fIndexCount);i++)
            {
                XMLInt32 mask=1UL << i;
                if(fLastValue & mask)
                    fLastValue &= ~mask;
            }
            // in case the 32 bit area contained only bits before 'start', advance
            if(fLastValue==0)
                findNext();
        }
    }